

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O3

void __thiscall
OpenMD::DynamicVector<double,_std::allocator<double>_>::mul
          (DynamicVector<double,_std::allocator<double>_> *this,
          DynamicVector<double,_std::allocator<double>_> *v1,double s)

{
  pointer pdVar1;
  double *pdVar2;
  double *pdVar3;
  
  pdVar1 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)(this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar1 != (long)pdVar3 - (long)pdVar2) {
    std::vector<double,_std::allocator<double>_>::resize
              (&this->data_,(long)pdVar3 - (long)pdVar2 >> 3);
    pdVar2 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar1 = (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  for (; pdVar2 != pdVar3; pdVar2 = pdVar2 + 1) {
    *pdVar1 = *pdVar2 * s;
    pdVar1 = pdVar1 + 1;
  }
  return;
}

Assistant:

void mul(const DynamicVector<Real>& v1, Real s) {
      if (this->size() != v1.size()) this->resize(v1.size());

      std::transform(v1.begin(), v1.end(), this->begin(),
                     [s](Real val) { return val * s; });
    }